

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

bool __thiscall absl::Mutex::AwaitCommon(Mutex *this,Condition *cond,KernelTimeout t)

{
  _func_bool_Condition_ptr *p_Var1;
  bool bVar2;
  undefined1 *puVar3;
  SynchWaitParams waitp;
  SynchWaitParams local_60;
  
  AssertReaderHeld(this);
  puVar3 = kExclusiveS;
  if (((this->mu_).super___atomic_base<long>._M_i & 8U) == 0) {
    puVar3 = kSharedS;
  }
  local_60.thread = &base_internal::CurrentThreadIdentityIfPresent()->per_thread_synch;
  if ((ThreadIdentity *)local_60.thread == (ThreadIdentity *)0x0) {
    local_60.thread = &synchronization_internal::CreateThreadIdentity()->per_thread_synch;
  }
  local_60.cvmu = (Mutex *)0x0;
  local_60.cv_word = (atomic<long> *)0x0;
  local_60.how = (MuHow)puVar3;
  local_60.cond = cond;
  local_60.timeout.ns_ = t.ns_;
  if (base_internal::CycleClock::cycle_clock_source_ == (code *)0x0) {
    local_60.contention_start_cycles = rdtsc();
  }
  else {
    local_60.contention_start_cycles = (*base_internal::CycleClock::cycle_clock_source_)();
  }
  local_60.contention_start_cycles = local_60.contention_start_cycles >> 2;
  p_Var1 = cond->eval_;
  UnlockSlow(this,&local_60);
  Block(this,local_60.thread);
  LockSlowLoop(this,&local_60,(uint)(p_Var1 != (_func_bool_Condition_ptr *)0x0) * 2 + 1);
  bVar2 = true;
  if ((local_60.cond == (Condition *)0x0) && (cond->eval_ != (_func_bool_Condition_ptr *)0x0)) {
    bVar2 = (*cond->eval_)(cond);
  }
  return bVar2;
}

Assistant:

bool Mutex::AwaitCommon(const Condition &cond, KernelTimeout t) {
  this->AssertReaderHeld();
  MuHow how =
      (mu_.load(std::memory_order_relaxed) & kMuWriter) ? kExclusive : kShared;
  ABSL_TSAN_MUTEX_PRE_UNLOCK(this, TsanFlags(how));
  SynchWaitParams waitp(
      how, &cond, t, nullptr /*no cvmu*/, Synch_GetPerThreadAnnotated(this),
      nullptr /*no cv_word*/);
  int flags = kMuHasBlocked;
  if (!Condition::GuaranteedEqual(&cond, nullptr)) {
    flags |= kMuIsCond;
  }
  this->UnlockSlow(&waitp);
  this->Block(waitp.thread);
  ABSL_TSAN_MUTEX_POST_UNLOCK(this, TsanFlags(how));
  ABSL_TSAN_MUTEX_PRE_LOCK(this, TsanFlags(how));
  this->LockSlowLoop(&waitp, flags);
  bool res = waitp.cond != nullptr ||  // => cond known true from LockSlowLoop
             EvalConditionAnnotated(&cond, this, true, false, how == kShared);
  ABSL_TSAN_MUTEX_POST_LOCK(this, TsanFlags(how), 0);
  return res;
}